

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_0.c
# Opt level: O1

void test_0(void)

{
  int iVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  stat_conflict st;
  stat local_98;
  
  failure("File %s does not exist?!",testprog);
  iVar1 = stat(testprogfile,&local_98);
  wVar2 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cat/test/test_0.c"
                              ,L'\x18',0,"0",(long)iVar1,"stat(testprogfile, &st)",(void *)0x0);
  if (wVar2 == L'\0') {
    test_0_cold_2();
  }
  else {
    failure("%s is not executable?!",testprog);
    wVar2 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cat/test/test_0.c"
                             ,L' ',(uint)(((byte)local_98.st_mode & 0x49) != 0),
                             "(st.st_mode & 0111) != 0",(void *)0x0);
    if (wVar2 != L'\0') {
      wVar2 = systemf("%s --version >/dev/null",testprog);
      if (wVar2 != L'\0') {
        failure("Unable to successfully run: %s --version\n",testprog);
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cat/test/test_0.c"
                         ,L'-',L'\0',"0",(void *)0x0);
        return;
      }
      return;
    }
  }
  test_0_cold_1();
  extract_reference_file("test_empty.gz");
  wVar2 = systemf("%s %s >test.out 2>test.err",testprog,"test_empty.gz");
  if (wVar2 != L'\0') {
    wVar3 = canGzip();
    if (wVar3 == L'\0') {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cat/test/test_empty_gz.c"
                     ,L'\x15');
      test_skipping("It seems gzip is not supported on this platform");
      return;
    }
  }
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cat/test/test_empty_gz.c"
                      ,L'\x11',0,"0",(long)wVar2,"f",(void *)0x0);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cat/test/test_empty_gz.c"
             ,L'\x12',"test.out");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cat/test/test_empty_gz.c"
             ,L'\x13',"test.err");
  return;
}

Assistant:

DEFINE_TEST(test_0)
{
	struct stat st;

	failure("File %s does not exist?!", testprog);
	if (!assertEqualInt(0, stat(testprogfile, &st))) {
		fprintf(stderr,
		    "\nFile %s does not exist; aborting test.\n\n",
		    testprog);
		exit(1);
	}

	failure("%s is not executable?!", testprog);
	if (!assert((st.st_mode & 0111) != 0)) {
		fprintf(stderr,
		    "\nFile %s not executable; aborting test.\n\n",
		    testprog);
		exit(1);
	}

	/*
	 * Try to successfully run the program; this requires that
	 * we know some option that will succeed.
	 */
	if (0 != systemf("%s --version >" DEV_NULL, testprog)) {
		failure("Unable to successfully run: %s --version\n", testprog);
		assert(0);
	}

	/* TODO: Ensure that our reference files are available. */
}